

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

String Bstrlib::operator+(tagbstring *x,String *b)

{
  uchar *extraout_RDX;
  String SVar1;
  String SStack_28;
  
  String::String(&SStack_28,&b->super_tagbstring);
  String::operator+((String *)x,&SStack_28);
  String::~String(&SStack_28);
  SVar1.super_tagbstring.data = extraout_RDX;
  SVar1.super_tagbstring._0_8_ = x;
  return (String)SVar1.super_tagbstring;
}

Assistant:

const String operator+(const tagbstring& x, const String& b)
    {
        return String(x) + b;
    }